

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

bool __thiscall
FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>
::hasFastAccess(FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>
                *this)

{
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_> *pFVar1;
  
  pFVar1 = (this->left_->fadexpr_).left_;
  if ((((((((pFVar1->fadexpr_).left_)->fadexpr_).right_)->dx_).num_elts != 0) &&
      ((((pFVar1->fadexpr_).right_)->dx_).num_elts != 0)) &&
     ((((this->left_->fadexpr_).right_)->dx_).num_elts != 0)) {
    return (((this->right_->fadexpr_).right_)->dx_).num_elts != 0;
  }
  return false;
}

Assistant:

bool hasFastAccess() const { return left_.hasFastAccess() && right_.hasFastAccess();}